

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_ghost.cpp
# Opt level: O1

void Omega_h::partition_by_verts(Mesh *mesh,bool verbose)

{
  int *piVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Alloc *pAVar3;
  LO nrroots;
  Remotes elem_uses;
  Read<long> old_owner_globals;
  Dist uses2old_owners;
  Dist elems2owners;
  Alloc *local_2c8;
  Alloc *local_2b8;
  GOs local_2a8;
  Alloc *local_298;
  element_type *local_290;
  Remotes local_288;
  CommPtr local_268;
  Dist local_258;
  Dist local_1c8;
  Dist local_138;
  Dist local_a8;
  
  get_own_verts2own_elems((RemoteGraph *)&local_258,mesh);
  local_288.idxs.write_.shared_alloc_.direct_ptr =
       local_258.roots2items_[1].write_.shared_alloc_.direct_ptr;
  local_288.ranks.write_.shared_alloc_.direct_ptr =
       local_258.roots2items_[0].write_.shared_alloc_.direct_ptr;
  local_2c8 = local_258.roots2items_[0].write_.shared_alloc_.alloc;
  if ((((ulong)local_258.roots2items_[0].write_.shared_alloc_.alloc & 7) == 0 &&
       local_258.roots2items_[0].write_.shared_alloc_.alloc != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    (local_258.roots2items_[0].write_.shared_alloc_.alloc)->use_count =
         (local_258.roots2items_[0].write_.shared_alloc_.alloc)->use_count + -1;
    local_2c8 = (Alloc *)((local_258.roots2items_[0].write_.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_258.roots2items_[0].write_.shared_alloc_.alloc = (Alloc *)0x0;
  local_258.roots2items_[0].write_.shared_alloc_.direct_ptr = (pointer)0x0;
  local_2b8 = local_258.roots2items_[1].write_.shared_alloc_.alloc;
  if ((((ulong)local_258.roots2items_[1].write_.shared_alloc_.alloc & 7) == 0 &&
       local_258.roots2items_[1].write_.shared_alloc_.alloc != (Alloc *)0x0) &&
     (entering_parallel == '\x01')) {
    (local_258.roots2items_[1].write_.shared_alloc_.alloc)->use_count =
         (local_258.roots2items_[1].write_.shared_alloc_.alloc)->use_count + -1;
    local_2b8 = (Alloc *)((local_258.roots2items_[1].write_.shared_alloc_.alloc)->size * 8 + 1);
  }
  local_258.roots2items_[1].write_.shared_alloc_.alloc = (Alloc *)0x0;
  local_258.roots2items_[1].write_.shared_alloc_.direct_ptr = (pointer)0x0;
  RemoteGraph::~RemoteGraph((RemoteGraph *)&local_258);
  Mesh::comm(mesh);
  local_288.ranks.write_.shared_alloc_.alloc = local_2c8;
  if (((ulong)local_2c8 & 7) == 0 && local_2c8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_288.ranks.write_.shared_alloc_.alloc = (Alloc *)(local_2c8->size * 8 + 1);
    }
    else {
      local_2c8->use_count = local_2c8->use_count + 1;
    }
  }
  local_288.idxs.write_.shared_alloc_.alloc = local_2b8;
  if (((ulong)local_2b8 & 7) == 0 && local_2b8 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_288.idxs.write_.shared_alloc_.alloc = (Alloc *)(local_2b8->size * 8 + 1);
    }
    else {
      local_2b8->use_count = local_2b8->use_count + 1;
    }
  }
  nrroots = Mesh::nelems(mesh);
  Dist::Dist(&local_258,&local_268,&local_288,nrroots);
  pAVar3 = local_288.idxs.write_.shared_alloc_.alloc;
  if (((ulong)local_288.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
      local_288.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    piVar1 = &(local_288.idxs.write_.shared_alloc_.alloc)->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(local_288.idxs.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  pAVar3 = local_288.ranks.write_.shared_alloc_.alloc;
  if (((ulong)local_288.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
      local_288.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             ((long)local_288.ranks.write_.shared_alloc_.alloc + 0x30);
    *(int *)&p_Var2->_vptr__Sp_counted_base = *(int *)&p_Var2->_vptr__Sp_counted_base + -1;
    if (*(int *)&p_Var2->_vptr__Sp_counted_base == 0) {
      Alloc::~Alloc(local_288.ranks.write_.shared_alloc_.alloc);
      operator_delete(pAVar3,0x48);
    }
  }
  if (local_268.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_268.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((uint)mesh->dim_ < 4) {
    Mesh::globals((Mesh *)&local_298,(Int)mesh);
    Dist::Dist(&local_138,&local_258);
    local_2a8.write_.shared_alloc_.alloc = local_298;
    if (((ulong)local_298 & 7) == 0 && local_298 != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_2a8.write_.shared_alloc_.alloc = (Alloc *)(local_298->size * 8 + 1);
      }
      else {
        local_298->use_count = local_298->use_count + 1;
      }
    }
    local_2a8.write_.shared_alloc_.direct_ptr = local_290;
    get_new_copies2old_owners(&local_a8,&local_138,&local_2a8);
    pAVar3 = local_2a8.write_.shared_alloc_.alloc;
    if (((ulong)local_2a8.write_.shared_alloc_.alloc & 7) == 0 &&
        local_2a8.write_.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_2a8.write_.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_2a8.write_.shared_alloc_.alloc);
        operator_delete(pAVar3,0x48);
      }
    }
    Dist::~Dist(&local_138);
    Dist::Dist(&local_1c8,&local_a8);
    migrate_mesh(mesh,&local_1c8,OMEGA_H_VERT_BASED,verbose);
    Dist::~Dist(&local_1c8);
    Dist::~Dist(&local_a8);
    if (((ulong)local_298 & 7) == 0 && local_298 != (Alloc *)0x0) {
      piVar1 = &local_298->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_298);
        operator_delete(local_298,0x48);
      }
    }
    Dist::~Dist(&local_258);
    if (((ulong)local_2b8 & 7) == 0 && local_2b8 != (Alloc *)0x0) {
      piVar1 = &local_2b8->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_2b8);
        operator_delete(local_2b8,0x48);
      }
    }
    if (((ulong)local_2c8 & 7) == 0 && local_2c8 != (Alloc *)0x0) {
      piVar1 = &local_2c8->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_2c8);
        operator_delete(local_2c8,0x48);
      }
    }
    return;
  }
  fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
       ,0x33);
}

Assistant:

void partition_by_verts(Mesh* mesh, bool verbose) {
  /* vertex-based partitioning is defined as gathering the elements
   * adjacent to owned vertices, hence the graph from owned vertices
   * to elements already contains what we need and we can skip push_elem_uses()
   */
  auto elem_uses = get_own_verts2own_elems(mesh).edges2remotes;
  auto uses2old_owners = Dist(mesh->comm(), elem_uses, mesh->nelems());
  auto old_owner_globals = mesh->globals(mesh->dim());
  auto elems2owners =
      get_new_copies2old_owners(uses2old_owners, old_owner_globals);
  migrate_mesh(mesh, elems2owners, OMEGA_H_VERT_BASED, verbose);
}